

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ostream *poVar2;
  TestPartResult *pTVar3;
  int line;
  TestInfo *pTVar4;
  TimeInMillis ms;
  int i;
  pointer pcVar5;
  char *pcVar6;
  int iVar7;
  string location;
  string message;
  string local_a0;
  int local_7c;
  TestResult *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = std::operator<<(stream,"    <testcase name=\"");
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)&local_a0,(test_info->name_)._M_dataplus._M_p);
  poVar2 = std::operator<<(poVar2,local_a0._M_dataplus._M_p);
  std::operator<<(poVar2,"\"");
  String::~String((String *)&local_a0);
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    poVar2 = std::operator<<(stream," value_param=\"");
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (pbVar1->_M_dataplus)._M_p;
    }
    EscapeXmlAttribute((XmlUnitTestResultPrinter *)&local_a0,pcVar5);
    poVar2 = internal::operator<<(poVar2,(String *)&local_a0);
    std::operator<<(poVar2,"\"");
    String::~String((String *)&local_a0);
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    poVar2 = std::operator<<(stream," type_param=\"");
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (pbVar1->_M_dataplus)._M_p;
    }
    EscapeXmlAttribute((XmlUnitTestResultPrinter *)&local_a0,pcVar5);
    poVar2 = internal::operator<<(poVar2,(String *)&local_a0);
    std::operator<<(poVar2,"\"");
    String::~String((String *)&local_a0);
  }
  poVar2 = std::operator<<(stream," status=\"");
  pcVar6 = "notrun";
  if (test_info->should_run_ != false) {
    pcVar6 = "run";
  }
  poVar2 = std::operator<<(poVar2,pcVar6);
  poVar2 = std::operator<<(poVar2,"\" time=\"");
  FormatTimeInMillisAsSeconds_abi_cxx11_
            (&local_a0,(internal *)(test_info->result_).elapsed_time_,ms);
  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
  poVar2 = std::operator<<(poVar2,"\" classname=\"");
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)&local_50,test_case_name);
  poVar2 = std::operator<<(poVar2,local_50._M_dataplus._M_p);
  poVar2 = std::operator<<(poVar2,"\"");
  local_78 = &test_info->result_;
  TestPropertiesAsXmlAttributes((XmlUnitTestResultPrinter *)&local_70,local_78);
  std::operator<<(poVar2,local_70._M_dataplus._M_p);
  String::~String((String *)&local_70);
  String::~String((String *)&local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  iVar7 = 0;
  for (i = 0; i < (int)((ulong)((long)(test_info->result_).test_part_results_.
                                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(test_info->result_).test_part_results_.
                                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6); i = i + 1) {
    pTVar4 = test_info;
    pTVar3 = TestResult::GetTestPartResult(local_78,i);
    line = (int)pTVar4;
    if (pTVar3->type_ != kSuccess) {
      local_7c = iVar7;
      if (iVar7 == 0) {
        std::operator<<(stream,">\n");
      }
      poVar2 = std::operator<<(stream,"      <failure message=\"");
      EscapeXmlAttribute((XmlUnitTestResultPrinter *)&local_a0,(pTVar3->summary_).c_str_);
      poVar2 = std::operator<<(poVar2,local_a0._M_dataplus._M_p);
      std::operator<<(poVar2,"\" type=\"\">");
      String::~String((String *)&local_a0);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&local_a0,(internal *)(pTVar3->file_name_).c_str_,
                 (char *)(ulong)(uint)pTVar3->line_number_,line);
      std::operator+(&local_70,&local_a0,"\n");
      std::operator+(&local_50,&local_70,(pTVar3->message_).c_str_);
      std::__cxx11::string::~string((string *)&local_70);
      RemoveInvalidXmlCharacters(&local_70,&local_50);
      iVar7 = local_7c;
      OutputXmlCDataSection(stream,local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
      std::operator<<(stream,"</failure>\n");
      iVar7 = iVar7 + 1;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  pcVar6 = "    </testcase>\n";
  if (iVar7 == 0) {
    pcVar6 = " />\n";
  }
  std::operator<<(stream,pcVar6);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string message = location + "\n" + part.message();
      OutputXmlCDataSection(stream,
                            RemoveInvalidXmlCharacters(message).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}